

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# univalue.cpp
# Opt level: O3

void __thiscall UniValue::pushKV(UniValue *this,string key,UniValue val)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  VType *pVVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  pointer pUVar8;
  pointer pbVar9;
  pointer pUVar10;
  string key_00;
  UniValue val_00;
  bool bVar11;
  VType *in_RDX;
  string *in_RSI;
  long in_FS_OFFSET;
  undefined8 in_stack_ffffffffffffff38;
  size_t in_stack_ffffffffffffff40;
  VType VVar12;
  undefined4 in_stack_ffffffffffffff4c;
  pointer in_stack_ffffffffffffff50;
  pointer in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff64;
  VType *pVVar13;
  undefined8 uVar14;
  undefined8 in_stack_ffffffffffffff80;
  size_type *local_48;
  size_type local_38;
  undefined8 uStack_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  VVar12 = VOBJ;
  checkType(this,(VType *)&stack0xffffffffffffff48);
  bVar11 = findKey(this,in_RSI,(size_t *)&stack0xffffffffffffff40);
  if (bVar11) {
    pUVar8 = (this->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
             super__Vector_impl_data._M_start + in_stack_ffffffffffffff40;
    pUVar8->typ = *in_RDX;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&pUVar8->val,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(in_RDX + 2));
    pbVar9 = *(pointer *)(in_RDX + 0xc);
    (pUVar8->keys).
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = *(undefined8 *)(in_RDX + 10);
    *(pointer *)
     ((long)&(pUVar8->keys).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl + 8) = pbVar9;
    *(pointer *)
     ((long)&(pUVar8->keys).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl + 0x10) = *(pointer *)(in_RDX + 0xe);
    in_RDX[0xe] = VNULL;
    in_RDX[0xf] = VNULL;
    in_RDX[10] = VNULL;
    in_RDX[0xb] = VNULL;
    in_RDX[0xc] = VNULL;
    in_RDX[0xd] = VNULL;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&stack0xffffffffffffff48);
    pUVar10 = *(pointer *)(in_RDX + 0x12);
    (pUVar8->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_start = *(undefined8 *)(in_RDX + 0x10);
    *(pointer *)
     ((long)&(pUVar8->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl + 8) =
         pUVar10;
    *(pointer *)
     ((long)&(pUVar8->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl + 0x10
     ) = *(pointer *)(in_RDX + 0x14);
    in_RDX[0x14] = VNULL;
    in_RDX[0x15] = VNULL;
    in_RDX[0x10] = VNULL;
    in_RDX[0x11] = VNULL;
    in_RDX[0x12] = VNULL;
    in_RDX[0x13] = VNULL;
    std::vector<UniValue,_std::allocator<UniValue>_>::~vector
              ((vector<UniValue,_std::allocator<UniValue>_> *)&stack0xffffffffffffff48);
  }
  else {
    local_48 = (size_type *)(in_RSI->_M_dataplus)._M_p;
    paVar1 = &in_RSI->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48 == paVar1) {
      local_38 = paVar1->_M_allocated_capacity;
      uStack_30 = *(undefined8 *)((long)&in_RSI->field_2 + 8);
      local_48 = &local_38;
    }
    else {
      local_38 = paVar1->_M_allocated_capacity;
    }
    (in_RSI->_M_dataplus)._M_p = (pointer)paVar1;
    in_RSI->_M_string_length = 0;
    (in_RSI->field_2)._M_local_buf[0] = '\0';
    pVVar2 = in_RDX + 6;
    if (*(VType **)(in_RDX + 2) == pVVar2) {
      uVar14 = *(undefined8 *)pVVar2;
      in_stack_ffffffffffffff80 = *(undefined8 *)(in_RDX + 8);
      pVVar13 = (VType *)&stack0xffffffffffffff78;
    }
    else {
      uVar14 = *(undefined8 *)pVVar2;
      pVVar13 = *(VType **)(in_RDX + 2);
    }
    uVar3 = *(undefined8 *)(in_RDX + 4);
    *(VType **)(in_RDX + 2) = pVVar2;
    in_RDX[4] = VNULL;
    in_RDX[5] = VNULL;
    *(undefined1 *)(in_RDX + 6) = VNULL;
    uVar5 = *(undefined8 *)(in_RDX + 10);
    uVar6 = *(undefined8 *)(in_RDX + 0xc);
    uVar4 = *(undefined8 *)(in_RDX + 0xe);
    in_RDX[0xe] = VNULL;
    in_RDX[0xf] = VNULL;
    in_RDX[10] = VNULL;
    in_RDX[0xb] = VNULL;
    in_RDX[0xc] = VNULL;
    in_RDX[0xd] = VNULL;
    uVar7 = *(undefined8 *)(in_RDX + 0x10);
    pUVar8 = *(pointer *)(in_RDX + 0x12);
    in_RDX[0x14] = VNULL;
    in_RDX[0x15] = VNULL;
    in_RDX[0x10] = VNULL;
    in_RDX[0x11] = VNULL;
    in_RDX[0x12] = VNULL;
    in_RDX[0x13] = VNULL;
    key_00._M_string_length = in_stack_ffffffffffffff40;
    key_00._M_dataplus._M_p = (pointer)in_stack_ffffffffffffff38;
    key_00.field_2._M_allocated_capacity._0_4_ = VVar12;
    key_00.field_2._M_allocated_capacity._4_4_ = in_stack_ffffffffffffff4c;
    key_00.field_2._8_8_ = in_stack_ffffffffffffff50;
    val_00.val._M_dataplus._M_p._0_4_ = *in_RDX;
    val_00._0_8_ = in_stack_ffffffffffffff58;
    val_00.val._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffff64;
    val_00.val._M_string_length = (size_type)pVVar13;
    val_00.val.field_2._M_allocated_capacity = uVar3;
    val_00.val.field_2._8_8_ = uVar14;
    val_00.keys.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_ffffffffffffff80;
    val_00.keys.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)uVar5;
    val_00.keys.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)uVar6;
    val_00.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)uVar4;
    val_00.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)uVar7;
    val_00.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = pUVar8;
    pushKVEnd(this,key_00,val_00);
    std::vector<UniValue,_std::allocator<UniValue>_>::~vector
              ((vector<UniValue,_std::allocator<UniValue>_> *)&stack0xffffffffffffffa0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&stack0xffffffffffffff88);
    if (pVVar13 != (VType *)&stack0xffffffffffffff78) {
      operator_delete(pVVar13,uVar14 + VOBJ);
    }
    if (local_48 != &local_38) {
      operator_delete(local_48,local_38 + 1);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void UniValue::pushKV(std::string key, UniValue val)
{
    checkType(VOBJ);

    size_t idx;
    if (findKey(key, idx))
        values[idx] = std::move(val);
    else
        pushKVEnd(std::move(key), std::move(val));
}